

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregion.cpp
# Opt level: O2

QRegion * __thiscall QRegion::operator+=(QRegion *this,QRegion *r)

{
  QRegionPrivate *pQVar1;
  QRegionPrivate *pQVar2;
  bool bVar3;
  
  pQVar1 = this->d->qt_rgn;
  if ((pQVar1 != (QRegionPrivate *)0x0) && (pQVar1->numRects != 0)) {
    pQVar2 = r->d->qt_rgn;
    if (pQVar2 == (QRegionPrivate *)0x0) {
      return this;
    }
    if (this->d == r->d) {
      return this;
    }
    if (pQVar2->numRects == 0) {
      return this;
    }
    bVar3 = QRegionPrivate::contains(pQVar1,&pQVar2->extents);
    if (bVar3) {
      return this;
    }
    bVar3 = QRegionPrivate::contains(r->d->qt_rgn,&this->d->qt_rgn->extents);
    if (!bVar3) {
      bVar3 = QRegionPrivate::canAppend(this->d->qt_rgn,r->d->qt_rgn);
      if (bVar3) {
        detach(this);
        QRegionPrivate::append(this->d->qt_rgn,r->d->qt_rgn);
        return this;
      }
      bVar3 = QRegionPrivate::canPrepend(this->d->qt_rgn,r->d->qt_rgn);
      if (bVar3) {
        detach(this);
        QRegionPrivate::prepend(this->d->qt_rgn,r->d->qt_rgn);
        return this;
      }
      bVar3 = EqualRegion(this->d->qt_rgn,r->d->qt_rgn);
      if (bVar3) {
        return this;
      }
      detach(this);
      pQVar1 = this->d->qt_rgn;
      UnionRegion(pQVar1,r->d->qt_rgn,pQVar1);
      return this;
    }
  }
  operator=(this,r);
  return this;
}

Assistant:

QRegion& QRegion::operator+=(const QRegion &r)
{
    if (isEmptyHelper(d->qt_rgn))
        return *this = r;
    if (isEmptyHelper(r.d->qt_rgn))
        return *this;
    if (d == r.d)
        return *this;

    if (d->qt_rgn->contains(*r.d->qt_rgn)) {
        return *this;
    } else if (r.d->qt_rgn->contains(*d->qt_rgn)) {
        return *this = r;
    } else if (d->qt_rgn->canAppend(r.d->qt_rgn)) {
        detach();
        d->qt_rgn->append(r.d->qt_rgn);
        return *this;
    } else if (d->qt_rgn->canPrepend(r.d->qt_rgn)) {
        detach();
        d->qt_rgn->prepend(r.d->qt_rgn);
        return *this;
    } else if (EqualRegion(d->qt_rgn, r.d->qt_rgn)) {
        return *this;
    } else {
        detach();
        UnionRegion(d->qt_rgn, r.d->qt_rgn, *d->qt_rgn);
        return *this;
    }
}